

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          StringViewArg filename,FieldDescriptorProto *field,FileDescriptorProto *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogMessage *pLVar2;
  bool bVar3;
  undefined8 *puVar4;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_78;
  FileDescriptorProto *local_50;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_*>,_bool>
  local_48;
  
  puVar4 = (undefined8 *)
           ((ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  bVar3 = true;
  if ((puVar4[1] != 0) && (*(char *)*puVar4 == '.')) {
    local_50 = value;
    std::__cxx11::string::substr((ulong)&local_98,(ulong)puVar4);
    local_78.second = (field->field_0)._impl_.number_;
    paVar1 = &local_78.first.field_2;
    if (local_98 == &local_88) {
      local_78.first.field_2._8_8_ = local_88._8_8_;
      local_78.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.first._M_dataplus._M_p = (pointer)local_98;
    }
    local_78.first.field_2._M_allocated_capacity._1_7_ = local_88._M_allocated_capacity._1_7_;
    local_78.first.field_2._M_local_buf[0] = local_88._M_local_buf[0];
    local_78.first._M_string_length = local_90;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_98 = &local_88;
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,256,false>>>
    ::emplace<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*&>
              (&local_48,&this->by_extension_,&local_78,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      local_78.first.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(local_88._M_allocated_capacity._1_7_,
                                        local_88._M_local_buf[0]) + 1);
    }
    if (local_48.second == false) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0x115);
      str._M_str = "Extension conflicts with extension already in database: extend ";
      str._M_len = 0x3f;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_78,str);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         ((LogMessage *)&local_78,
                          (string *)
                          ((ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc));
      str_00._M_str = " { ";
      str_00._M_len = 3;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar2,str_00);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(string *)
                                 ((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc));
      str_01._M_str = " = ";
      str_01._M_len = 3;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar2,str_01);
      local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44(local_98._4_4_,(field->field_0)._impl_.number_);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                         (pLVar2,(int *)&local_98);
      str_02._M_str = " } from:";
      str_02._M_len = 8;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar2,str_02);
      absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,filename);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_78);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    StringViewArg filename, const FieldDescriptorProto& field, Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!by_extension_
             .emplace(
                 std::make_pair(field.extendee().substr(1), field.number()),
                 value)
             .second) {
      ABSL_LOG(ERROR)
          << "Extension conflicts with extension already in database: "
             "extend "
          << field.extendee() << " { " << field.name() << " = "
          << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}